

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_iterator.hpp
# Opt level: O2

void __thiscall
burst::detail::
join_iterator_impl<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::iterators::random_access_traversal_tag>
::forward(join_iterator_impl<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::iterators::random_access_traversal_tag>
          *this,difference_type n)

{
  long lVar1;
  
  for (; 0 < n; n = n - lVar1) {
    lVar1 = (long)(((this->m_outer)._M_current)->
                  super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
                  ).
                  super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
                  .
                  super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                  .m_End - (long)this->m_inner >> 2;
    if (n <= lVar1) {
      lVar1 = n;
    }
    this->m_inner = this->m_inner + lVar1;
    maintain_invariant(this);
  }
  return;
}

Assistant:

void forward (typename base_type::difference_type n)
            {
                while (n > 0)
                {
                    auto items_remaining_in_current_range = std::distance(m_inner, m_outer->end());
                    auto items_to_scroll_in_current_range = std::min(n, items_remaining_in_current_range);
                    n -= items_to_scroll_in_current_range;
                    m_inner += items_to_scroll_in_current_range;

                    maintain_invariant();
                }
            }